

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O2

char * flags_to_string(CHAR_DATA *ch,flag_type *showflags,int flagsperline)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  char temp_value [4608];
  
  temp_value._0_8_ = temp_value._0_8_ & 0xffffffffffffff00;
  pcVar3 = showflags->name;
  if (pcVar3 != (char *)0x0) {
    iVar4 = 1;
    do {
      strcat(temp_value,pcVar3);
      sVar1 = strlen(temp_value);
      pcVar2 = temp_value + sVar1;
      if (iVar4 % flagsperline == 0) {
        temp_value[sVar1 + 2] = '\0';
        pcVar2[0] = '\n';
        pcVar2[1] = '\r';
      }
      else {
        pcVar2[0] = ' ';
        pcVar2[1] = '\0';
      }
      iVar4 = iVar4 + 1;
    } while( true );
  }
  builtin_strncpy(temp_value,"Error looking up flag names.\n\r",0x1f);
  pcVar3 = palloc_string(temp_value);
  return pcVar3;
}

Assistant:

char *flags_to_string(CHAR_DATA *ch, const struct flag_type *showflags, int flagsperline)
{
	int flag, col = 0;
	char temp_value[MAX_INPUT_LENGTH];
	temp_value[0] = '\0';

	for (flag = 0; showflags[flag].name != nullptr; flag = flag++)
	{
		strcat(temp_value, showflags[flag].name);

		if (++col % flagsperline == 0)
			strcat(temp_value, "\n\r");
		else
			strcat(temp_value, " ");
	}

	if (temp_value[0] == '\0')
		sprintf(temp_value, "Error looking up flag names.\n\r");

	return palloc_string(temp_value);
}